

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::fulfill
          (Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this,
          FixVoid<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *value)

{
  ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> EStack_1e8;
  
  if ((this->super_CoroutineBase).waiting == true) {
    ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::ExceptionOr
              (&EStack_1e8,value);
    ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::operator=
              (&this->result,&EStack_1e8);
    ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
    ~ExceptionOr(&EStack_1e8);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }